

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O1

int write_signer_info(CBB *out,void *arg)

{
  byte bVar1;
  int iVar2;
  ASN1_OCTET_STRING *str;
  uchar *data;
  X509_NAME *in;
  ASN1_INTEGER *in_00;
  EVP_PKEY *pkey;
  EVP_MD *md;
  int lib;
  int line;
  EVP_MD_CTX *ctx;
  size_t sig_len;
  uint8_t *ptr;
  CBB seq;
  CBB signature;
  CBB signing_algo;
  CBB child;
  CBB null;
  size_t local_128;
  uchar *local_120;
  CBB local_118;
  CBB local_e8;
  CBB local_b8;
  CBB local_88;
  CBB local_58;
  
  bVar1 = *(byte *)((long)arg + 0x28);
  iVar2 = CBB_add_asn1(out,&local_118,0x20000010);
  if (iVar2 == 0) {
    return 0;
  }
  iVar2 = CBB_add_asn1_uint64(&local_118,(ulong)bVar1 * 2 + 1);
  if (iVar2 == 0) {
    return 0;
  }
  if (*(char *)((long)arg + 0x28) == '\x01') {
    str = X509_get0_subject_key_id(*arg);
    if (str == (ASN1_OCTET_STRING *)0x0) {
      lib = 0x21;
      iVar2 = 100;
      line = 0x1a5;
      goto LAB_0049a6f1;
    }
    data = ASN1_STRING_get0_data(str);
    iVar2 = ASN1_STRING_length((ASN1_STRING *)str);
    iVar2 = CBB_add_asn1_element(&local_118,0x80000000,data,(long)iVar2);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    iVar2 = CBB_add_asn1(&local_118,&local_88,0x20000010);
    if (iVar2 == 0) {
      return 0;
    }
    in = (X509_NAME *)X509_get_subject_name(*arg);
    iVar2 = x509_marshal_name(&local_88,in);
    if (iVar2 == 0) {
      return 0;
    }
    in_00 = X509_get0_serialNumber(*arg);
    iVar2 = asn1_marshal_integer(&local_88,in_00,0);
    if (iVar2 == 0) {
      return 0;
    }
  }
  pkey = EVP_PKEY_CTX_get0_pkey(*(EVP_PKEY_CTX **)((long)arg + 0x18));
  iVar2 = EVP_PKEY_id(pkey);
  if (iVar2 == 6) {
    ctx = (EVP_MD_CTX *)((long)arg + 8);
    md = EVP_MD_CTX_get0_md((EVP_MD_CTX *)ctx);
    iVar2 = EVP_marshal_digest_algorithm_no_params(&local_118,md);
    if (((iVar2 == 0) || (iVar2 = CBB_add_asn1(&local_118,&local_b8,0x20000010), iVar2 == 0)) ||
       (iVar2 = OBJ_nid2cbb(&local_b8,6), iVar2 == 0)) {
      return 0;
    }
    iVar2 = CBB_add_asn1(&local_b8,&local_58,5);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = EVP_DigestSignFinal(ctx,(uchar *)0x0,&local_128);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = CBB_add_asn1(&local_118,&local_e8,4);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = CBB_reserve(&local_e8,&local_120,local_128);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = EVP_DigestSignFinal(ctx,local_120,&local_128);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = CBB_did_write(&local_e8,local_128);
    if (iVar2 != 0) {
      iVar2 = CBB_flush(out);
      return (uint)(iVar2 != 0);
    }
    return 0;
  }
  lib = 0x12;
  iVar2 = 0x42;
  line = 0x1bf;
LAB_0049a6f1:
  ERR_put_error(lib,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_x509.cc"
                ,line);
  return 0;
}

Assistant:

static int write_signer_info(CBB *out, void *arg) {
  auto *si_data = static_cast<struct signer_info_data *>(arg);

  uint64_t version = si_data->use_key_id ? 3u : 1u;
  CBB seq, child, signing_algo, null, signature;
  if (!CBB_add_asn1(out, &seq, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&seq, version)) {
    return 0;
  }

  // Output the SignerIdentifier.
  if (si_data->use_key_id) {
    const ASN1_OCTET_STRING *skid =
        X509_get0_subject_key_id(si_data->sign_cert);
    if (skid == nullptr) {
      OPENSSL_PUT_ERROR(CMS, CMS_R_CERTIFICATE_HAS_NO_KEYID);
      return 0;
    }
    // subjectKeyIdentifier is implicitly-tagged.
    if (!CBB_add_asn1_element(&seq, CBS_ASN1_CONTEXT_SPECIFIC | 0,
                              ASN1_STRING_get0_data(skid),
                              ASN1_STRING_length(skid))) {
      return 0;
    }
  } else {
    if (!CBB_add_asn1(&seq, &child, CBS_ASN1_SEQUENCE) ||
        !x509_marshal_name(&child, X509_get_subject_name(si_data->sign_cert)) ||
        !asn1_marshal_integer(&child,
                              X509_get0_serialNumber(si_data->sign_cert),
                              /*tag=*/0)) {
      return 0;
    }
  }

  // Output the digest and signature algorithm. This cannot use X.509 signature
  // algorithms because CMS incorrectly decomposes signature algorithms into a
  // combination of digesting and "encrypting" the digest, then uses the plain
  // rsaEncryption OID instead of the hash-specific RSA OIDs. For now, we only
  // support RSA.
  EVP_PKEY *pkey = EVP_PKEY_CTX_get0_pkey(si_data->sign_ctx->pctx);
  if (EVP_PKEY_id(pkey) != EVP_PKEY_RSA) {
    OPENSSL_PUT_ERROR(PKCS7, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }
  if (!EVP_marshal_digest_algorithm_no_params(
          &seq, EVP_MD_CTX_get0_md(si_data->sign_ctx.get())) ||
      !CBB_add_asn1(&seq, &signing_algo, CBS_ASN1_SEQUENCE) ||
      !OBJ_nid2cbb(&signing_algo, NID_rsaEncryption) ||
      !CBB_add_asn1(&signing_algo, &null, CBS_ASN1_NULL)) {
    return 0;
  }

  // Output the signature.
  uint8_t *ptr;
  size_t sig_len;
  if (!EVP_DigestSignFinal(si_data->sign_ctx.get(), nullptr, &sig_len) ||
      !CBB_add_asn1(&seq, &signature, CBS_ASN1_OCTETSTRING) ||
      !CBB_reserve(&signature, &ptr, sig_len) ||
      !EVP_DigestSignFinal(si_data->sign_ctx.get(), ptr, &sig_len) ||
      !CBB_did_write(&signature, sig_len) ||  //
      !CBB_flush(out)) {
    return 0;
  }

  return 1;
}